

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMAController.cpp
# Opt level: O2

void __thiscall Atari::ST::DMAController::DMAController(DMAController *this)

{
  (this->super_Source).observer_ = (Observer *)0x0;
  (this->super_Delegate)._vptr_Delegate = (_func_int **)&PTR_wd1770_did_change_output_00582980;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_005829a8;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_005829c0;
  (this->running_time_).super_WrappedInt<HalfCycles>.length_ = 0;
  WD1772::WD1772(&this->fdc_);
  this->control_ = 0;
  this->delegate_ = (Delegate *)0x0;
  this->interrupt_line_ = false;
  this->bus_request_line_ = false;
  this->buffer_[0].is_full = false;
  this->address_ = 0;
  this->byte_count_ = 0;
  *(undefined8 *)&this->buffer_[1].is_full = 0;
  *(undefined2 *)((long)&this->bytes_received_ + 3) = 0;
  (this->fdc_).super_WD1770.delegate_ = &this->super_Delegate;
  (this->fdc_).super_WD1770.super_MFMController.super_Controller.super_Source.observer_ =
       &this->super_Observer;
  ClockingHint::Source::update_clocking_observer((Source *)&this->fdc_);
  return;
}

Assistant:

DMAController::DMAController() {
	fdc_.set_delegate(this);
	fdc_.set_clocking_hint_observer(this);
}